

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputContactMessageContent.h
# Opt level: O0

void __thiscall
TgBot::InputContactMessageContent::InputContactMessageContent(InputContactMessageContent *this)

{
  allocator local_31;
  string local_30;
  InputContactMessageContent *local_10;
  InputContactMessageContent *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"InputContactMessageContent",&local_31);
  InputMessageContent::InputMessageContent(&this->super_InputMessageContent,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_InputMessageContent)._vptr_InputMessageContent =
       (_func_int **)&PTR__InputContactMessageContent_0051ba28;
  std::__cxx11::string::string((string *)&this->phoneNumber);
  std::__cxx11::string::string((string *)&this->firstName);
  std::__cxx11::string::string((string *)&this->lastName);
  std::__cxx11::string::string((string *)&this->vcard);
  return;
}

Assistant:

InputContactMessageContent() :
        InputMessageContent("InputContactMessageContent")
    {}